

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O3

bool WriteBase(ON_SubDComponentBase *base,ON_BinaryArchive *archive)

{
  ON__UINT32 i;
  ON__UINT32 i_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  double P [3];
  double adStack_48 [4];
  
  i = base->m_id;
  i_00 = base->m_archive_id;
  uVar3 = ON_SubDComponentBase::SubdivisionLevel(base);
  bVar1 = ON_BinaryArchive::WriteInt(archive,i_00);
  if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(archive,i), bVar1)) &&
     (bVar1 = ON_BinaryArchive::WriteShort(archive,(ON__UINT16)uVar3), bVar1)) {
    iVar4 = ON_BinaryArchive::Archive3dmVersion(archive);
    if (iVar4 < 0x46) {
      bVar1 = ON_SubDComponentBase::GetSavedSubdivisionPoint(base,adStack_48);
      bVar2 = ON_BinaryArchive::WriteChar(archive,bVar1 << 2);
      if (bVar2) {
        if ((!bVar1) || (bVar1 = ON_BinaryArchive::WriteDouble(archive,3,adStack_48), bVar1)) {
          bVar1 = ON_BinaryArchive::WriteChar(archive,'\0');
          if (bVar1) {
            return true;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
        }
      }
    }
    else {
      bVar1 = Internal_WriteComponentAdditionSize(false,archive,'\x18');
      if (bVar1) {
        uVar3 = base->m_group_id;
        bVar1 = Internal_WriteComponentAdditionSize(uVar3 != 0,archive,'\x04');
        if ((bVar1) &&
           ((uVar3 == 0 || (bVar1 = ON_BinaryArchive::WriteInt(archive,base->m_group_id), bVar1))))
        {
          bVar1 = ON_SubDComponentBase::InSymmetrySet(base);
          bVar2 = Internal_WriteComponentAdditionSize(bVar1,archive,'\x05');
          if ((bVar2) &&
             ((!bVar1 ||
              (bVar1 = Internal_WritesSymmetrySetNext
                                 ((ON_SubDComponentBase *)(base->m_symmetry_set_next).m_ptr,archive)
              , bVar1)))) {
            bVar1 = Internal_FinishWritingComponentAdditions(archive);
            return bVar1;
          }
        }
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool WriteBase(
  const ON_SubDComponentBase* base,
  ON_BinaryArchive& archive
  )
{
  for (;;)
  {
    unsigned int archive_id = base->ArchiveId();
    unsigned int id = base->m_id;
    unsigned short level = (unsigned short)base->SubdivisionLevel();
    if (!archive.WriteInt(archive_id))
      break;
    if (!archive.WriteInt(id))
      break;
    if (!archive.WriteShort(level))
      break;

    if (archive.Archive3dmVersion() < 70)
    {
      // version 6 3dm files
      double P[3];
      const bool bHaveP = base->GetSavedSubdivisionPoint(P);

      unsigned char cP = bHaveP ? 4U : 0U;
      if (!archive.WriteChar(cP))
        break;
      if (0 != cP)
      {
        if (!Internal_WriteDouble3(P, archive))
          break;
      }

      unsigned char deprecated_and_never_used_zero = 0U;
      if (!archive.WriteChar(deprecated_and_never_used_zero))
        break;
      return true;
    }
    
    // version 7 3dm files and later

    // never used displacement
    if ( false == Internal_WriteComponentAdditionSize(false,archive,24) )
      break;

    // 4 byte group id addition
    const bool bWriteGroupId = base->m_group_id > 0;
    if (false == Internal_WriteComponentAdditionSize(bWriteGroupId, archive, 4))
      break;
    if (bWriteGroupId)
    {
      if (!archive.WriteInt(base->m_group_id))
        break;
    }

    // 5 byte symmetry set next addition Dec 2020 Rhino 7.2 and later
    // 5 bytes = unsigned archive id + char flags
    const bool bWriteSymmetrySetNext = base->InSymmetrySet();
    if (false == Internal_WriteComponentAdditionSize(bWriteSymmetrySetNext, archive, 5))
      break;
    if (bWriteSymmetrySetNext)
    {
      if (!Internal_WritesSymmetrySetNext(*base,archive))
        break;
    }

    return Internal_FinishWritingComponentAdditions(archive);
  }
  return ON_SUBD_RETURN_ERROR(false);
}